

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O1

bool __thiscall
text_subtitles::TextSubtitlesRender::rasterText(TextSubtitlesRender *this,string *text)

{
  undefined4 *puVar1;
  long lVar2;
  float fVar3;
  uint32_t uVar4;
  pointer ppVar5;
  int iVar6;
  int iVar7;
  pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *j;
  iterator __end2;
  pointer ppVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  string *psVar12;
  int iVar13;
  vector<int,_std::allocator<int>_> xSize;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  txtParts;
  RECT rect;
  SIZE mSize;
  vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> fontStack;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  int local_12c;
  int local_128;
  int local_124;
  float local_120;
  void *local_118;
  iterator iStack_110;
  int *local_108;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  Font *local_d0;
  string *local_c8;
  string *local_c0;
  string *local_b8;
  ulong local_b0;
  ulong local_a8;
  undefined8 local_a0;
  long local_90 [2];
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 local_70;
  vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  memset(this->m_pData,0,(long)this->m_height * (long)this->m_width * 4);
  local_68.super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  splitStr_abi_cxx11_(&local_48,(text->_M_dataplus)._M_p,'\n');
  std::__cxx11::string::_M_assign((string *)&this->m_initFont);
  fVar3 = (this->m_font).m_lineSpacing;
  (this->m_initFont).m_color = (this->m_font).m_color;
  (this->m_initFont).m_lineSpacing = fVar3;
  iVar10 = (this->m_font).m_opts;
  fVar3 = (this->m_font).m_borderWidth;
  uVar4 = (this->m_font).m_charset;
  (this->m_initFont).m_size = (this->m_font).m_size;
  (this->m_initFont).m_opts = iVar10;
  (this->m_initFont).m_borderWidth = fVar3;
  (this->m_initFont).m_charset = uVar4;
  local_128 = 0;
  local_c0 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  psVar12 = (string *)&this->m_font;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar13 = 0;
    iVar10 = local_128;
    local_d0 = &this->m_initFont;
    local_c8 = (string *)&this->m_font;
    do {
      local_128 = iVar10;
      local_b8 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      processTxtLine(&local_f8,this,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,&local_68);
      ppVar5 = local_f8.
               super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar8 = local_f8.
                    super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar8 != local_f8.
                    super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; ppVar8 = ppVar8 + 1) {
        if (((ppVar8->first).m_opts & 0x10) != 0) {
          iVar13 = 1;
        }
      }
      local_118 = (void *)0x0;
      iStack_110._M_current = (int *)0x0;
      local_108 = (int *)0x0;
      if (local_f8.
          super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_f8.
          super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar10 = 0;
        local_120 = 0.0;
        local_12c = 0;
        local_124 = 0;
      }
      else {
        local_124 = 0;
        local_12c = 0;
        iVar10 = 0;
        iVar7 = 0;
        ppVar8 = local_f8.
                 super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          (*this->_vptr_TextSubtitlesRender[2])(this,ppVar8);
          (*this->_vptr_TextSubtitlesRender[4])(this,&ppVar8->second,&local_a0);
          if (iVar7 <= local_a0._4_4_) {
            iVar7 = local_a0._4_4_;
          }
          iVar6 = (*this->_vptr_TextSubtitlesRender[5])(this);
          if (local_12c <= iVar6) {
            local_12c = (*this->_vptr_TextSubtitlesRender[5])(this);
          }
          iVar6 = (*this->_vptr_TextSubtitlesRender[6])(this);
          if (local_124 <= iVar6) {
            local_124 = (*this->_vptr_TextSubtitlesRender[6])(this);
          }
          if (iStack_110._M_current == local_108) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_118,iStack_110,(int *)&local_a0);
          }
          else {
            *iStack_110._M_current = (int)local_a0;
            iStack_110._M_current = iStack_110._M_current + 1;
          }
          iVar10 = iVar10 + (int)local_a0;
          ppVar8 = ppVar8 + 1;
        } while (ppVar8 != ppVar5);
        local_120 = (float)iVar7;
      }
      if (local_f8.
          super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_f8.
          super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_b0 = (ulong)(uint)((this->m_width - iVar10) / 2);
        uVar9 = 0;
        lVar11 = 0x38;
        iVar10 = 0;
        do {
          ppVar8 = local_f8.
                   super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_a0 = local_90;
          lVar2 = *(long *)((long)local_f8.
                                  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x38);
          local_a8 = uVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,lVar2,
                     *(long *)((long)local_f8.
                                     super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x30) +
                     lVar2);
          local_70 = *(undefined8 *)((long)ppVar8 + lVar11 + -8);
          puVar1 = (undefined4 *)((long)ppVar8 + lVar11 + -0x18);
          local_80 = *puVar1;
          uStack_7c = puVar1[1];
          uStack_78 = puVar1[2];
          uStack_74 = puVar1[3];
          (*this->_vptr_TextSubtitlesRender[2])(this,(string *)&local_a0);
          local_e0 = (int)local_b0 + iVar10;
          iVar7 = (*this->_vptr_TextSubtitlesRender[5])(this);
          local_dc = (*this->_vptr_TextSubtitlesRender[6])(this);
          local_dc = ((local_12c + local_128) - (iVar7 + local_124)) + local_dc;
          local_d8 = this->m_width;
          local_d4 = this->m_height;
          (*this->_vptr_TextSubtitlesRender[7])
                    (this,(long)&((local_f8.
                                   super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first).m_name.
                                 _M_dataplus._M_p + lVar11,&local_e0);
          uVar9 = local_a8;
          iVar10 = iVar10 + *(int *)((long)local_118 + local_a8 * 4);
          if (local_a0 != local_90) {
            operator_delete(local_a0,local_90[0] + 1);
          }
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + 0x58;
        } while (uVar9 < (ulong)(((long)local_f8.
                                        super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_f8.
                                        super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                0x2e8ba2e8ba2e8ba3));
      }
      lVar11 = lroundf(local_120 * (this->m_font).m_lineSpacing);
      if (local_118 != (void *)0x0) {
        operator_delete(local_118,(long)local_108 - (long)local_118);
      }
      iVar10 = local_128 + (int)lVar11;
      std::
      vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_f8);
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_b8 + 1;
      psVar12 = local_c8;
      local_128 = iVar13;
    } while (local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != local_c0);
  }
  (*this->_vptr_TextSubtitlesRender[8])(this);
  std::__cxx11::string::_M_assign(psVar12);
  fVar3 = (this->m_initFont).m_lineSpacing;
  (this->m_font).m_color = (this->m_initFont).m_color;
  (this->m_font).m_lineSpacing = fVar3;
  iVar10 = (this->m_initFont).m_opts;
  fVar3 = (this->m_initFont).m_borderWidth;
  uVar4 = (this->m_initFont).m_charset;
  (this->m_font).m_size = (this->m_initFont).m_size;
  (this->m_font).m_opts = iVar10;
  (this->m_font).m_borderWidth = fVar3;
  (this->m_font).m_charset = uVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::~vector(&local_68);
  return SUB41(local_128,0);
}

Assistant:

bool TextSubtitlesRender::rasterText(const std::string& text)
{
    bool forced = false;
    memset(m_pData, 0, static_cast<size_t>(m_width) * m_height * 4);
    vector<Font> fontStack;
    const vector<string> lines = splitStr(text.c_str(), '\n');
    int curY = 0;
    m_initFont = m_font;
    for (auto& i : lines)
    {
        vector<pair<Font, string>> txtParts = processTxtLine(i, fontStack);
        for (const auto& j : txtParts)
        {
            if (j.first.m_opts & Font::FORCED)
                forced = true;
        }

        int ySize = 0;
        int tWidth = 0;
        int maxHeight = 0;
        int maxBaseLine = 0;
        vector<int> xSize;
        for (auto& j : txtParts)
        {
            setFont(j.first);
            SIZE mSize;
            getTextSize(j.second, &mSize);
            ySize = FFMAX(ySize, mSize.cy);
            maxHeight = FFMAX(maxHeight, getLineSpacing());
            maxBaseLine = FFMAX(maxBaseLine, getBaseline());
            xSize.push_back(mSize.cx);
            tWidth += mSize.cx;
        }
        const int xOffs = (m_width - tWidth) / 2;
        int curX = 0;
        for (size_t j = 0; j < txtParts.size(); j++)
        {
            Font font(txtParts[j].first);
            setFont(font);

            RECT rect = {curX + xOffs, curY + (maxHeight - getLineSpacing()) - (maxBaseLine - getBaseline()), m_width,
                         m_height};
            drawText(txtParts[j].second, &rect);

            curX += xSize[j];
        }
        curY += lround(static_cast<float>(ySize) * m_font.m_lineSpacing);
    }
    flushRasterBuffer();
    m_font = m_initFont;

    return forced;
}